

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_finish_close(uv_udp_t *handle)

{
  undefined8 *puVar1;
  int iVar2;
  long *plVar3;
  
  iVar2 = uv__io_active(&handle->io_watcher,5);
  if (iVar2 != 0) {
    __assert_fail("!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x44,"void uv__udp_finish_close(uv_udp_t *)");
  }
  if ((handle->io_watcher).fd == -1) {
    plVar3 = (long *)handle->write_queue[0];
    if (handle->write_queue != (void **)plVar3) {
      do {
        *(long *)plVar3[1] = *plVar3;
        *(long *)(*plVar3 + 8) = plVar3[1];
        plVar3[0x14] = -0x7d;
        *plVar3 = (long)handle->write_completed_queue;
        puVar1 = (undefined8 *)handle->write_completed_queue[1];
        plVar3[1] = (long)puVar1;
        *puVar1 = plVar3;
        handle->write_completed_queue[1] = plVar3;
        plVar3 = (long *)handle->write_queue[0];
      } while (handle->write_queue != (void **)plVar3);
    }
    uv__udp_run_completed(handle);
    if (handle->send_queue_size == 0) {
      if (handle->send_queue_count == 0) {
        handle->alloc_cb = (uv_alloc_cb)0x0;
        handle->recv_cb = (uv_udp_recv_cb)0x0;
        return;
      }
      __assert_fail("handle->send_queue_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0x53,"void uv__udp_finish_close(uv_udp_t *)");
    }
    __assert_fail("handle->send_queue_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x52,"void uv__udp_finish_close(uv_udp_t *)");
  }
  __assert_fail("handle->io_watcher.fd == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                ,0x45,"void uv__udp_finish_close(uv_udp_t *)");
}

Assistant:

void uv__udp_finish_close(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
  assert(handle->io_watcher.fd == -1);

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    req->status = UV_ECANCELED;
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
  }

  uv__udp_run_completed(handle);

  assert(handle->send_queue_size == 0);
  assert(handle->send_queue_count == 0);

  /* Now tear down the handle. */
  handle->recv_cb = NULL;
  handle->alloc_cb = NULL;
  /* but _do not_ touch close_cb */
}